

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(int argc,char **argv)

{
  void *pvVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  gbspace_t gVar6;
  option_t *poVar7;
  list_t *__filename;
  sourcefile_t *psVar8;
  ulong uVar9;
  char *pcVar10;
  ulong uVar11;
  block_header_t *pbVar12;
  section_entry_t *psVar13;
  FILE *pFVar14;
  uchar *__ptr;
  char *__filename_00;
  bool bVar15;
  char *p;
  int bank_num;
  section_entry_t *sect_2;
  symbol_entry_t *syms;
  int jr;
  int target_addr;
  section_entry_t *symbol_sect;
  section_entry_t *reloc_sect;
  symbol_entry_t *target_sym;
  list_t *target_syms;
  reloc_entry_t *reloc_1;
  list_t *lfile;
  symbol_entry_t *tsym;
  list_t *tsyms;
  symbol_entry_t *sym_1;
  list_t *sfile_1;
  section_entry_t *sect_1;
  list_t *sfile;
  reloc_entry_t *reloc;
  symbol_entry_t *sym;
  uint k;
  section_entry_t *sect;
  block_header_t *header;
  char *filename;
  size_t fsize;
  int gen_debug;
  list_t *psyms2;
  list_t *psyms1;
  FILE *outfile;
  char *output_name;
  sourcefile_t *file;
  list_t *list;
  uint numrelocs;
  uint numsyms;
  uint numsect;
  int file_id;
  int i;
  undefined4 in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffebc;
  list_t *in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffecc;
  undefined4 in_stack_fffffffffffffed0;
  uint in_stack_fffffffffffffed4;
  list_t *plVar16;
  list_t **in_stack_fffffffffffffee0;
  uint local_114;
  section_entry_t *local_f8;
  _func_void_varargs *in_stack_ffffffffffffff20;
  list_s *plVar17;
  _func_void_varargs *in_stack_ffffffffffffff28;
  int *piVar18;
  undefined8 in_stack_ffffffffffffff30;
  char **in_stack_ffffffffffffff38;
  undefined8 in_stack_ffffffffffffff40;
  list_s *local_58;
  list_t *local_50;
  list_t *local_30;
  int local_14;
  int local_4;
  
  iVar3 = (int)((ulong)in_stack_ffffffffffffff40 >> 0x20);
  iVar2 = (int)((ulong)in_stack_ffffffffffffff30 >> 0x20);
  esetprogram("gbld");
  esetonfatal(on_fatal_error);
  parse_options(iVar3,in_stack_ffffffffffffff38,iVar2,in_stack_ffffffffffffff28,
                in_stack_ffffffffffffff20);
  iVar2 = errors();
  if (iVar2 == 0) {
    poVar7 = get_option((char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    strlen((poVar7->value).str);
    __filename = (list_t *)mmalloc((size_t)in_stack_fffffffffffffec0);
    plVar16 = __filename;
    poVar7 = get_option((char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    strcpy((char *)plVar16,(poVar7->value).str);
    poVar7 = get_option((char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    iVar2 = poVar7->set;
    init_rom();
    file_first();
    while (psVar8 = file_next(), psVar8 != (sourcefile_t *)0x0) {
      esetfile((char *)in_stack_fffffffffffffec0);
      infile = (FILE *)fopen(psVar8->name,"rb");
      if ((FILE *)infile == (FILE *)0x0) {
        ccerr(F,"unable to open \"%s\"",psVar8->name);
      }
      else {
        fseek((FILE *)infile,0,2);
        uVar9 = ftell((FILE *)infile);
        fseek((FILE *)infile,0,0);
        set_infile(infile);
        read_obj_header();
        strlen(psVar8->name);
        pcVar10 = (char *)mmalloc((size_t)in_stack_fffffffffffffec0);
        strcpy(pcVar10,psVar8->name);
        list_add(in_stack_fffffffffffffee0,(int)((ulong)plVar16 >> 0x20),
                 (void *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                 in_stack_fffffffffffffecc);
        while (uVar11 = ftell((FILE *)infile), uVar11 < uVar9) {
          pbVar12 = read_block_header();
          init_map();
          if (pbVar12->type == sections) {
            for (local_14 = 0; local_14 < pbVar12->num_entries; local_14 = local_14 + 1) {
              read_section_entry();
              list_add(in_stack_fffffffffffffee0,(int)((ulong)plVar16 >> 0x20),
                       (void *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                       in_stack_fffffffffffffecc);
            }
          }
          else if (pbVar12->type == symbols) {
            for (local_14 = 0; local_14 < pbVar12->num_entries; local_14 = local_14 + 1) {
              read_symbol_entry();
              list_add(in_stack_fffffffffffffee0,(int)((ulong)plVar16 >> 0x20),
                       (void *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                       in_stack_fffffffffffffecc);
            }
          }
          else if (pbVar12->type == relocations) {
            for (local_14 = 0; local_14 < pbVar12->num_entries; local_14 = local_14 + 1) {
              read_reloc_entry();
              list_add(in_stack_fffffffffffffee0,(int)((ulong)plVar16 >> 0x20),
                       (void *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                       in_stack_fffffffffffffecc);
            }
          }
        }
        fclose((FILE *)infile);
      }
    }
    for (local_50 = lsymbols; local_50 != (list_t *)0x0; local_50 = local_50->next) {
      local_58 = local_50->next;
      while (local_58 != (list_s *)0x0) {
        if (local_50->file_id == local_58->file_id) {
          local_58 = local_58->next;
        }
        else if ((*(int *)((long)local_50->data + 0x2c) == 1) &&
                (*(int *)((long)local_58->data + 0x2c) == 1)) {
          iVar3 = strcmp((char *)((long)local_50->data + 4),(char *)((long)local_58->data + 4));
          if (iVar3 == 0) {
            ccerr(E,"duplicate symbol \'%s\'",(long)local_58->data + 4);
          }
          local_58 = local_58->next;
        }
        else {
          local_58 = local_58->next;
        }
      }
    }
    local_30 = lsections;
    while (local_30 != (list_t *)0x0) {
      list_at(lfiles,local_30->file_id);
      pvVar1 = local_30->data;
      esetfile((char *)in_stack_fffffffffffffec0);
      if (*(int *)((long)pvVar1 + 4) == 0) {
        uVar4 = allocate((char *)plVar16,
                         (section_entry_t *)
                         CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
        *(uint *)((long)pvVar1 + 8) = uVar4;
        local_30->flags = 1;
        local_30 = local_30->next;
      }
      else {
        local_30 = local_30->next;
      }
    }
    local_30 = lsymbols;
    while (local_30 != (list_t *)0x0) {
      list_at(lfiles,local_30->file_id);
      pvVar1 = local_30->data;
      if (*(int *)((long)pvVar1 + 0x2c) == 2) {
        plVar17 = lsymbols;
        esetfile((char *)in_stack_fffffffffffffec0);
        while (plVar17 != (list_t *)0x0) {
          in_stack_ffffffffffffff38 = (char **)plVar17->data;
          if ((local_30->file_id == plVar17->file_id) ||
             (*(int *)((long)in_stack_ffffffffffffff38 + 0x2c) != 1)) {
            plVar17 = plVar17->next;
          }
          else {
            iVar3 = strcmp((char *)((long)pvVar1 + 4),(char *)((long)in_stack_ffffffffffffff38 + 4))
            ;
            if (iVar3 == 0) break;
            plVar17 = plVar17->next;
          }
        }
        if (plVar17 == (list_t *)0x0) {
          err(E,"symbol \'%s\' unsolved",(long)pvVar1 + 4);
        }
        else {
          local_30->flags = plVar17->file_id;
          *(undefined4 *)((long)pvVar1 + 0x24) =
               *(undefined4 *)((long)in_stack_ffffffffffffff38 + 0x24);
          *(undefined4 *)((long)pvVar1 + 0x28) = *(undefined4 *)(in_stack_ffffffffffffff38 + 5);
        }
        local_30 = local_30->next;
      }
      else {
        local_30 = local_30->next;
      }
    }
    for (local_30 = lrelocations; local_30 != (list_t *)0x0; local_30 = local_30->next) {
      list_at(lfiles,local_30->file_id);
      piVar18 = (int *)local_30->data;
      plVar17 = lsymbols;
      esetfile((char *)in_stack_fffffffffffffec0);
      while (plVar17 != (list_t *)0x0) {
        if (plVar17->file_id == local_30->file_id) {
          if (*plVar17->data == *piVar18) break;
          plVar17 = plVar17->next;
        }
        else {
          plVar17 = plVar17->next;
        }
      }
      if (plVar17 == (list_t *)0x0) {
        err(F,"relocation entries corrupted");
      }
      pvVar1 = plVar17->data;
      psVar13 = get_section(local_30->file_id,piVar18[1]);
      if (*(int *)((long)pvVar1 + 0x2c) == 2) {
        local_f8 = get_section(plVar17->flags,*(uint *)((long)pvVar1 + 0x24));
      }
      else {
        local_f8 = get_section(plVar17->file_id,*(uint *)((long)pvVar1 + 0x24));
      }
      iVar3 = local_f8->offset + *(int *)((long)pvVar1 + 0x28);
      if (piVar18[3] == 1) {
        iVar3 = iVar3 - (psVar13->offset + piVar18[2] + 1);
        psVar13->data[piVar18[2]] = (uchar)iVar3;
        if ((0x80 < iVar3) || (iVar3 < -0x7f)) {
          err(E,"relative jump to \'%s\' out of reach",(long)pvVar1 + 4);
        }
      }
      else {
        psVar13->data[piVar18[2]] = (uchar)iVar3;
        psVar13->data[piVar18[2] + 1] = (uchar)((uint)iVar3 >> 8);
      }
    }
    local_30 = lsections;
    while( true ) {
      in_stack_fffffffffffffed4 = in_stack_fffffffffffffed4 & 0xffffff;
      if (local_30 != (list_t *)0x0) {
        iVar3 = errors();
        in_stack_fffffffffffffed4 =
             CONCAT13(iVar3 != 0,(int3)in_stack_fffffffffffffed4) ^ 0xff000000;
      }
      if ((in_stack_fffffffffffffed4 & 0x1000000) == 0) break;
      write_section((section_entry_t *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0)
                   );
      local_30 = local_30->next;
    }
    iVar3 = errors();
    if (iVar3 == 0) {
      pFVar14 = fopen((char *)__filename,"wb");
      if (pFVar14 == (FILE *)0x0) {
        ccerr(F,"unable to open \"%s\"",__filename);
      }
      fix_rom();
      local_14 = 0;
      while (iVar3 = local_14, iVar5 = get_num_rom_banks(), iVar3 < iVar5) {
        __ptr = get_rom_bank(in_stack_fffffffffffffebc);
        fwrite(__ptr,0x4000,1,pFVar14);
        local_14 = local_14 + 1;
      }
      fclose(pFVar14);
    }
    iVar3 = errors();
    if ((iVar3 == 0) && (plVar16 = __filename, iVar2 != 0)) {
      for (; (char)plVar16->file_id != '\0'; plVar16 = (list_t *)((long)&plVar16->file_id + 1)) {
      }
      for (; (char)plVar16->file_id != '.' && plVar16 != __filename;
          plVar16 = (list_t *)((long)&plVar16[-1].next + 7)) {
      }
      if ((char)plVar16->file_id == '.') {
        *(char *)&plVar16->file_id = '\0';
      }
      strlen((char *)__filename);
      __filename_00 =
           (char *)mrealloc(__filename,CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8)
                           );
      for (pcVar10 = __filename_00; *pcVar10 != '\0'; pcVar10 = pcVar10 + 1) {
      }
      builtin_strncpy(pcVar10,".sym",4);
      local_30 = lsymbols;
      pFVar14 = fopen(__filename_00,"w");
      if (pFVar14 == (FILE *)0x0) {
        ccerr(F,"unable to open \"%s\"",__filename_00);
      }
      while( true ) {
        bVar15 = false;
        if (local_30 != (list_t *)0x0) {
          iVar2 = errors();
          bVar15 = iVar2 == 0;
        }
        if (!bVar15) break;
        pvVar1 = local_30->data;
        if (*(int *)((long)pvVar1 + 0x2c) != 2) {
          psVar13 = get_section(local_30->file_id,*(uint *)((long)pvVar1 + 0x24));
          gVar6 = get_space(psVar13->offset);
          if (gVar6 == rom_n) {
            local_114 = psVar13->bank_num + 1;
          }
          else {
            local_114 = psVar13->bank_num;
          }
          fprintf(pFVar14,"%02X:%04X %s\n",(ulong)local_114,
                  (ulong)(uint)(psVar13->offset + *(int *)((long)pvVar1 + 0x28)),(long)pvVar1 + 4);
        }
        local_30 = local_30->next;
      }
      fclose(pFVar14);
      in_stack_fffffffffffffec0 = __filename;
    }
    free_rom();
    free_map();
    list_free(in_stack_fffffffffffffec0);
    list_free(in_stack_fffffffffffffec0);
    list_free(in_stack_fffffffffffffec0);
    list_free(in_stack_fffffffffffffec0);
    local_4 = 0;
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main(int argc, char** argv)
{
    int i, file_id = 0;
    unsigned numsect = 0, numsyms = 0, numrelocs = 0;
    list_t* list;
    sourcefile_t* file = NULL;
    char* output_name = NULL;
    FILE* outfile = NULL;
    list_t* psyms1, * psyms2;
    int gen_debug = 0;


    esetprogram(pgm);
    esetonfatal(&on_fatal_error);

    parse_options(argc, argv, GBLD, &help, &version);

    if (errors())
        return EXIT_FAILURE;

    output_name = (char*)mmalloc(strlen(get_option("-o")->value.str) + 1);
    strcpy(output_name, get_option("-o")->value.str);

    gen_debug = get_option("-g")->set;

    init_rom();

    file_first();
    while ((file = file_next()))
    {
        size_t fsize;
        char* filename;
        esetfile(file->name);
        if (! (infile = fopen(file->name, "rb")))
        {
            ccerr(F, "unable to open \"%s\"", file->name);
            continue;
        }

        fseek(infile, 0, SEEK_END);
        fsize = ftell(infile);
        fseek(infile, 0, SEEK_SET);

        set_infile(infile);
        read_obj_header();

        filename = (char*)mmalloc(strlen(file->name) + 1);
        strcpy(filename, file->name);
        list_add(&lfiles, file_id, filename, 0);

        while (ftell(infile) < fsize)
        {
            block_header_t* header= read_block_header();
            init_map();

            if (header->type == sections)
            {
                section_entry_t* sect;
#ifndef NDEBUG
                printf("New sections block with %d entries\n", header->num_entries);
#endif
                for (i = 0; i < header->num_entries; ++i)
                {
                    unsigned k;
                    sect = read_section_entry();
                    list_add(&lsections, file_id, sect, 0);
                    ++numsect;
#ifndef NDEBUG
                    printf("  * Section %d\n", sect->id);
                    printf("    - Type:      %s\n", sect->type == org ? ".org" : "");
                    printf("    - Offset:    %04x\n", sect->offset);
                    printf("    - Bank:      %d\n", sect->bank_num);
                    printf("    - Data size: %d\n", sect->data_size);
                    for (k = 0; k < sect->data_size; ++k)
                    {
                        if (k && (k % 16) == 0)
                            printf("\n");
                        else if (k && (k % 8) == 0)
                            printf(" ");
                        printf("%02X ", sect->data[k]);

                    }
                    printf("\n");
#endif
                }
            }
            else if (header->type == symbols)
            {
                symbol_entry_t* sym;
#ifndef NDEBUG
                printf("New symbols block with %d entries\n", header->num_entries);
#endif
                for (i = 0; i < header->num_entries; ++i)
                {
                    sym = read_symbol_entry();
                    list_add(&lsymbols, file_id, sym, file_id);
                    ++numsyms;
#ifndef NDEBUG
                    printf("  * Symbol %d\n", sym->sym_id);
                    printf("    - ID:         %s\n", sym->id);
                    printf("    - In section: %d\n", sym->section_id);
                    printf("    - Offset:     %d\n", sym->offset);
                    printf("    - Type:       %c\n", ".GE"[sym->type]);
                    printf("\n");
#endif
                }
            }
            else if (header->type == relocations)
            {
                reloc_entry_t* reloc;
#ifndef NDEBUG
                printf("New relocations block with %d entries\n", header->num_entries);
#endif
                for (i = 0; i < header->num_entries; ++i)
                {
                    reloc = read_reloc_entry();
                    ++numrelocs;
                    list_add(&lrelocations, file_id, reloc, 0);
#ifndef NDEBUG
                    printf("  * Relocation\n");
                    printf("    - Symbol: %d\n", reloc->sym_id);
                    printf("    - Section: %d\n", reloc->section_id);
                    printf("    - Offset: %d\n", reloc->offset);
#endif
                }
            }
        }

        fclose(infile);
        ++file_id;
    }

    /* Search for duplicate global symbols */
    psyms1 = lsymbols;
    while (psyms1)
    {
        psyms2 = psyms1->next;
        while (psyms2)
        {
            if (psyms1->file_id == psyms2->file_id)
            {
                psyms2 = psyms2->next;
                continue;
            }
            if (((symbol_entry_t*)(psyms1->data))->type != _global
                || ((symbol_entry_t*)(psyms2->data))->type != _global)
            {
                psyms2 = psyms2->next;
                continue;
            }
            if (strcmp((const char*)((symbol_entry_t*)(psyms1->data))->id,
                       (const char*)((symbol_entry_t*)(psyms2->data))->id)
                == 0)
            {
                ccerr(E, "duplicate symbol '%s'",
                    ((symbol_entry_t*)(psyms2->data))->id);
            }

            psyms2 = psyms2->next;
        }
        psyms1 = psyms1->next;
    }

    /* .org allocation */
    list = lsections;
    while (list)
    {
        list_t* sfile = list_at(lfiles, list->file_id);
        section_entry_t* sect = (section_entry_t*)list->data;
        esetfile(sfile->data);

        if (sect->type != org)
        {
            list = list->next;
            continue;
        }

        sect->offset = allocate(sfile->data, sect);
        list->flags = SECT_TREATED;

        list = list->next;
    }

    TODO("rom/ram/wram/vram + offset");
    TODO("rom/ram/wram/vram");

    /* link extern symbols */
    list = lsymbols;
    while(list)
    {
        list_t* sfile = list_at(lfiles, list->file_id);
        symbol_entry_t* sym = (symbol_entry_t*)(list->data);
        list_t* tsyms = lsymbols; /* target symbols list */
        symbol_entry_t* tsym;     /* target symbol */

        if (sym->type != _extern)
        {
            list = list->next;
            continue;
        }

        esetfile((char*)sfile->data);
        while (tsyms)
        {
            tsym = (symbol_entry_t*)(tsyms->data);
            if (list->file_id == tsyms->file_id || tsym->type != _global)
            {
                tsyms = tsyms->next;
                continue;
            }

            if (strcmp((char*)sym->id, (char*)tsym->id) == 0)
                break;

            tsyms = tsyms->next;
        }

        if (tsyms == NULL)
            err(E, "symbol '%s' unsolved", sym->id);
        else
        {
            list->flags = tsyms->file_id; /* flag = target file id */
            sym->section_id = tsym->section_id;
            sym->offset = tsym->offset;
        }

        list = list->next;
    }

    /* relocs */
    list = lrelocations;
    while (list)
    {
        list_t* lfile = list_at(lfiles, list->file_id);
        reloc_entry_t* reloc = (reloc_entry_t*)(list->data);
        list_t* target_syms = lsymbols;
        symbol_entry_t* target_sym;
        section_entry_t* reloc_sect;
        section_entry_t* symbol_sect;
        int target_addr;

        esetfile((char*)lfile->data);

        /* search for target symbol among symbols created in the same file */
        while (target_syms)
        {
            if (target_syms->file_id != list->file_id)
            {
                target_syms = target_syms->next;
                continue;
            }
            if (((symbol_entry_t*)(target_syms->data))->sym_id == reloc->sym_id)
                break;
            target_syms = target_syms->next;
        }

        if (target_syms == NULL)
            err(F, "relocation entries corrupted");

        target_sym = (symbol_entry_t*)(target_syms->data);
        reloc_sect = get_section(list->file_id, reloc->section_id);
        if (target_sym->type == _extern)
            symbol_sect = get_section(target_syms->flags, target_sym->section_id);
        else
            symbol_sect = get_section(target_syms->file_id, target_sym->section_id);


        target_addr = symbol_sect->offset + target_sym->offset;
        if (reloc->flags == relative)
        {
            int jr = target_addr - (reloc_sect->offset + reloc->offset + 1);
            reloc_sect->data[reloc->offset] = jr;
            if (jr > 128 || jr < -127)
                err(E, "relative jump to '%s' out of reach", target_sym->id);
        }
        else
        {
            reloc_sect->data[reloc->offset] = target_addr & 0xFF;
            reloc_sect->data[reloc->offset + 1] = (target_addr >> 8) & 0xFF;
        }

        list = list->next;
    }

    /* Write sections to rom banks */
    list = lsections;
    while (list && !errors())
    {
        write_section((section_entry_t*)(list->data));
        list = list->next;
    }

    if (!errors())
    {
        if ( ! (outfile = fopen(output_name, "wb")) )
            ccerr(F, "unable to open \"%s\"", output_name);

        fix_rom();
        for (i = 0; i < get_num_rom_banks(); ++i)
            fwrite(get_rom_bank(i), ROM_BANK_SIZE, 1, outfile);
        fclose(outfile);
    }

    /* Write sym file */
    if (!errors() && gen_debug)
    {
        symbol_entry_t* syms;
        section_entry_t* sect;
        int bank_num;
        char* p = output_name;

        while (*p)
            ++p;
        while (*p != '.' && p != output_name)
            --p;
        if (*p == '.')
            *p = 0;
        output_name = (char*)mrealloc(output_name, strlen(output_name) + 4);
        p = output_name;
        while (*p != 0)
            ++p;
        *p++ = '.';
        *p++ = 's';
        *p++ = 'y';
        *p++ = 'm';
        list = lsymbols;

        if ( ! (outfile = fopen(output_name, "w")) )
            ccerr(F, "unable to open \"%s\"", output_name);

        while (list && !errors())
        {
            syms = (symbol_entry_t*)(list->data);
            if (syms->type != _extern)
            {
                sect = get_section(list->file_id, syms->section_id);
                if (get_space(sect->offset) == rom_n)
                    bank_num = sect->bank_num + 1;
                else
                    bank_num = sect->bank_num;
                fprintf(outfile, "%02X:%04X %s\n", bank_num,
                       sect->offset + syms->offset, syms->id);
            }
            list = list->next;
        }

        fclose(outfile);
    }

    free_rom();
    free_map();
    list_free(lfiles);
    list_free(lsections);
    list_free(lsymbols);
    list_free(lrelocations);

    return EXIT_SUCCESS;
}